

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::InternalSwap
          (UniDirectionalLSTMLayerParams *this,UniDirectionalLSTMLayerParams *other)

{
  bool bVar1;
  intptr_t iVar2;
  LSTMParams *pLVar3;
  LSTMWeightParams *pLVar4;
  LSTMWeightParams *pLVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  
  iVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::InternalSwap
            (&this->activations_,&other->activations_);
  pLVar3 = this->params_;
  pLVar4 = this->weightparams_;
  pLVar5 = other->weightparams_;
  this->params_ = other->params_;
  this->weightparams_ = pLVar5;
  other->params_ = pLVar3;
  other->weightparams_ = pLVar4;
  uVar6 = this->inputvectorsize_;
  uVar7 = this->outputvectorsize_;
  uVar8 = other->outputvectorsize_;
  this->inputvectorsize_ = other->inputvectorsize_;
  this->outputvectorsize_ = uVar8;
  other->inputvectorsize_ = uVar6;
  other->outputvectorsize_ = uVar7;
  bVar1 = this->reverseinput_;
  this->reverseinput_ = other->reverseinput_;
  other->reverseinput_ = bVar1;
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::InternalSwap(UniDirectionalLSTMLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  activations_.InternalSwap(&other->activations_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(UniDirectionalLSTMLayerParams, reverseinput_)
      + sizeof(UniDirectionalLSTMLayerParams::reverseinput_)
      - PROTOBUF_FIELD_OFFSET(UniDirectionalLSTMLayerParams, params_)>(
          reinterpret_cast<char*>(&params_),
          reinterpret_cast<char*>(&other->params_));
}